

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Option<Catch::TagAlias>::reset(Option<Catch::TagAlias> *this)

{
  TagAlias *pTVar1;
  pointer pcVar2;
  
  pTVar1 = this->nullableValue;
  if (pTVar1 != (TagAlias *)0x0) {
    pcVar2 = (pTVar1->lineInfo).file._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pTVar1->lineInfo).file.field_2) {
      operator_delete(pcVar2);
    }
    pcVar2 = (pTVar1->tag)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pTVar1->tag).field_2) {
      operator_delete(pcVar2);
    }
  }
  this->nullableValue = (TagAlias *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = CATCH_NULL;
        }